

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSourceData::RTPSourceData(RTPSourceData *this,uint32_t s,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  uint32_t s_local;
  RTPSourceData *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_00192cc0;
  std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::list
            (&this->packetlist);
  RTCPSenderReportInfo::RTCPSenderReportInfo(&this->SRinf);
  RTCPSenderReportInfo::RTCPSenderReportInfo(&this->SRprevinf);
  RTCPReceiverReportInfo::RTCPReceiverReportInfo(&this->RRinf);
  RTCPReceiverReportInfo::RTCPReceiverReportInfo(&this->RRprevinf);
  RTPSourceStats::RTPSourceStats(&this->stats);
  RTCPSDESInfo::RTCPSDESInfo(&this->SDESinf,mgr);
  RTPTime::RTPTime(&this->byetime,0,0);
  this->ssrc = s;
  this->issender = false;
  this->iscsrc = false;
  this->timestampunit = -1.0;
  this->receivedbye = false;
  this->byereason = (uint8_t *)0x0;
  this->byereasonlen = 0;
  this->rtpaddr = (RTPAddress *)0x0;
  this->rtcpaddr = (RTPAddress *)0x0;
  this->ownssrc = false;
  this->validated = false;
  this->processedinrtcp = false;
  this->isrtpaddrset = false;
  this->isrtcpaddrset = false;
  return;
}

Assistant:

RTPSourceData::RTPSourceData(uint32_t s, RTPMemoryManager *mgr) : RTPMemoryObject(mgr),SDESinf(mgr),byetime(0,0)
{
	ssrc = s;
	issender = false;
	iscsrc = false;
	timestampunit = -1;
	receivedbye = false;
	byereason = 0;
	byereasonlen = 0;
	rtpaddr = 0;
	rtcpaddr = 0;
	ownssrc = false;
	validated = false;
	processedinrtcp = false;			
	isrtpaddrset = false;
	isrtcpaddrset = false;
}